

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_then.cpp
# Opt level: O2

void __thiscall tst_qpromise_then::functionPtrHandlers(tst_qpromise_then *this)

{
  char cVar1;
  QPromiseBase<float> *pQVar2;
  float *pfVar3;
  float fVar4;
  Promise p2;
  Promise p1;
  Promise p0;
  QPromiseBase<float> local_50;
  QPromiseBase<float> local_40;
  QPromiseBase<float> local_30;
  QPromiseBase<float> local_20;
  code *local_10;
  
  QtPromise::resolve();
  local_50._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_1f92a::fnNoArg;
  QtPromise::QPromiseBase<void>::then<float(*)()>
            ((QPromiseBase<void> *)&local_20,(_func_float **)&local_30);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_30);
  QtPromise::resolve<float_const&>((float *)&local_50);
  local_40._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_1f92a::fnArgByVal;
  QtPromise::QPromiseBase<float>::then<float(*)(float)>(&local_30,(_func_float_float **)&local_50);
  QtPromise::QPromiseBase<float>::~QPromiseBase(&local_50);
  QtPromise::resolve<float_const&>((float *)&local_40);
  local_10 = anon_unknown.dwarf_1f92a::fnArgByRef;
  pQVar2 = &local_40;
  QtPromise::QPromiseBase<float>::then<float(*)(float_const&)>
            (&local_50,(_func_float_float_ptr **)pQVar2);
  QtPromise::QPromiseBase<float>::~QPromiseBase(&local_40);
  fVar4 = waitForValue<float>((QPromise<float> *)&local_20,(float *)pQVar2);
  pfVar3 = (float *)&(anonymous_namespace)::kRes;
  local_40._vptr_QPromiseBase._0_4_ = fVar4;
  cVar1 = QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                          "waitForValue(p0, kFail)","kRes",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,0xbc);
  if (cVar1 != '\0') {
    local_40._vptr_QPromiseBase._0_4_ = waitForValue<float>((QPromise<float> *)&local_30,pfVar3);
    pfVar3 = (float *)&(anonymous_namespace)::kRes;
    cVar1 = QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                            "waitForValue(p1, kFail)","kRes",
                            "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                            ,0xbd);
    if (cVar1 != '\0') {
      fVar4 = waitForValue<float>((QPromise<float> *)&local_50,pfVar3);
      local_40._vptr_QPromiseBase = (_func_int **)CONCAT44(local_40._vptr_QPromiseBase._4_4_,fVar4);
      cVar1 = QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                              "waitForValue(p2, kFail)","kRes",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xbe);
      QtPromise::QPromiseBase<float>::~QPromiseBase(&local_50);
      QtPromise::QPromiseBase<float>::~QPromiseBase(&local_30);
      QtPromise::QPromiseBase<float>::~QPromiseBase(&local_20);
      if (cVar1 == '\0') {
        return;
      }
      QtPromise::resolve();
      local_50._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_1f92a::Klass::kFnNoArg;
      QtPromise::QPromiseBase<void>::then<float(*)()>
                ((QPromiseBase<void> *)&local_20,(_func_float **)&local_30);
      QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_30);
      QtPromise::resolve<float_const&>((float *)&local_50);
      local_40._vptr_QPromiseBase = (_func_int **)anon_unknown.dwarf_1f92a::Klass::kFnArgByVal;
      QtPromise::QPromiseBase<float>::then<float(*)(float)>
                (&local_30,(_func_float_float **)&local_50);
      QtPromise::QPromiseBase<float>::~QPromiseBase(&local_50);
      QtPromise::resolve<float_const&>((float *)&local_40);
      local_10 = anon_unknown.dwarf_1f92a::Klass::kFnArgByRef;
      pQVar2 = &local_40;
      QtPromise::QPromiseBase<float>::then<float(*)(float_const&)>
                (&local_50,(_func_float_float_ptr **)pQVar2);
      QtPromise::QPromiseBase<float>::~QPromiseBase(&local_40);
      fVar4 = waitForValue<float>((QPromise<float> *)&local_20,(float *)pQVar2);
      pfVar3 = (float *)&(anonymous_namespace)::kRes;
      local_40._vptr_QPromiseBase._0_4_ = fVar4;
      cVar1 = QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                              "waitForValue(p0, kFail)","kRes",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                              ,0xc5);
      if (cVar1 != '\0') {
        local_40._vptr_QPromiseBase._0_4_ = waitForValue<float>((QPromise<float> *)&local_30,pfVar3)
        ;
        pfVar3 = (float *)&(anonymous_namespace)::kRes;
        cVar1 = QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                                "waitForValue(p1, kFail)","kRes",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                                ,0xc6);
        if (cVar1 != '\0') {
          local_40._vptr_QPromiseBase._0_4_ =
               waitForValue<float>((QPromise<float> *)&local_50,pfVar3);
          QTest::qCompare((float *)&local_40,(float *)&(anonymous_namespace)::kRes,
                          "waitForValue(p2, kFail)","kRes",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_then.cpp"
                          ,199);
        }
      }
    }
  }
  QtPromise::QPromiseBase<float>::~QPromiseBase(&local_50);
  QtPromise::QPromiseBase<float>::~QPromiseBase(&local_30);
  QtPromise::QPromiseBase<float>::~QPromiseBase(&local_20);
  return;
}

Assistant:

void tst_qpromise_then::functionPtrHandlers()
{
    { // Global functions.
        auto p0 = QtPromise::resolve().then(&fnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&fnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&fnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
    { // Static member functions.
        auto p0 = QtPromise::resolve().then(&Klass::kFnNoArg);
        auto p1 = QtPromise::resolve(kRes).then(&Klass::kFnArgByVal);
        auto p2 = QtPromise::resolve(kRes).then(&Klass::kFnArgByRef);

        QCOMPARE(waitForValue(p0, kFail), kRes);
        QCOMPARE(waitForValue(p1, kFail), kRes);
        QCOMPARE(waitForValue(p2, kFail), kRes);
    }
}